

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

Option * __thiscall
CLI::App::set_version_flag(App *this,string *flag_name,string *versionString,string *version_help)

{
  bool bVar1;
  Option *pOVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  anon_class_32_1_1f2bc529 *in_RDI;
  string *in_stack_00000028;
  function<void_()> *in_stack_00000030;
  string *in_stack_00000038;
  App *in_stack_00000040;
  function<void_()> *in_stack_ffffffffffffff50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  Option *in_stack_ffffffffffffffa0;
  App *in_stack_ffffffffffffffa8;
  
  if (in_RDI[0xc].versionString._M_dataplus._M_p != (pointer)0x0) {
    remove_option(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    in_RDI[0xc].versionString._M_dataplus._M_p = (pointer)0x0;
  }
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1b7e2e);
  if (!bVar1) {
    ::std::__cxx11::string::string(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    ::std::__cxx11::string::string(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    ::std::function<void()>::
    function<CLI::App::set_version_flag(std::__cxx11::string,std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda()_1_,void>
              (in_stack_ffffffffffffff50,in_RDI);
    ::std::__cxx11::string::string(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    pOVar2 = add_flag_callback(in_stack_00000040,in_stack_00000038,in_stack_00000030,
                               in_stack_00000028);
    in_RDI[0xc].versionString._M_dataplus._M_p = (pointer)pOVar2;
    ::std::__cxx11::string::~string(in_RSI);
    std::function<void_()>::~function((function<void_()> *)0x1b7ec7);
    set_version_flag(std::__cxx11::string,std::__cxx11::string_const&,std::__cxx11::string_const&)::
    {lambda()#1}::~basic_string((anon_class_32_1_1f2bc529 *)0x1b7ed1);
    ::std::__cxx11::string::~string(in_RSI);
    OptionBase<CLI::Option>::configurable
              ((OptionBase<CLI::Option> *)in_RDI[0xc].versionString._M_dataplus._M_p,false);
  }
  return (Option *)in_RDI[0xc].versionString._M_dataplus._M_p;
}

Assistant:

CLI11_INLINE Option *
App::set_version_flag(std::string flag_name, const std::string &versionString, const std::string &version_help) {
    // take flag_description by const reference otherwise add_flag tries to assign to version_description
    if(version_ptr_ != nullptr) {
        remove_option(version_ptr_);
        version_ptr_ = nullptr;
    }

    // Empty name will simply remove the version flag
    if(!flag_name.empty()) {
        version_ptr_ = add_flag_callback(
            flag_name, [versionString]() { throw(CLI::CallForVersion(versionString, 0)); }, version_help);
        version_ptr_->configurable(false);
    }

    return version_ptr_;
}